

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_isnext(jit_State *J,BCReg ra)

{
  TRef TVar1;
  TRef TVar2;
  TValue *pTVar3;
  IRRef1 local_4c;
  TRef trid;
  TRef func;
  cTValue *b;
  BCReg ra_local;
  jit_State *J_local;
  
  pTVar3 = J->L->base + (ra - 3);
  if (((((int)(pTVar3->field_4).it >> 0xf == -9) &&
       (*(char *)((pTVar3->u64 & 0x7fffffffffff) + 10) == '\x04')) &&
      ((int)pTVar3[1].field_4.it >> 0xf == -0xc)) && (pTVar3[2].u64 == 0xffffffffffffffff)) {
    if (J->base[ra - 3] == 0) {
      TVar1 = sload(J,ra - 3);
      local_4c = (IRRef1)TVar1;
    }
    else {
      local_4c = (IRRef1)J->base[ra - 3];
    }
    (J->fold).ins.field_0.ot = 0x4510;
    (J->fold).ins.field_0.op1 = local_4c;
    (J->fold).ins.field_0.op2 = 3;
    TVar1 = lj_opt_fold(J);
    TVar2 = lj_ir_kint(J,4);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    if (J->base[ra - 2] == 0) {
      sload(J,ra - 2);
    }
    if (J->base[ra - 1] == 0) {
      sload(J,ra - 1);
    }
    TVar1 = lj_ir_kint(J,0);
    J->base[ra - 1] = TVar1 | 0x100000;
    J->maxslot = ra;
    return;
  }
  lj_trace_err(J,LJ_TRERR_RECERR);
}

Assistant:

static void rec_isnext(jit_State *J, BCReg ra)
{
  cTValue *b = &J->L->base[ra-3];
  if (tvisfunc(b) && funcV(b)->c.ffid == FF_next &&
      tvistab(b+1) && tvisnil(b+2)) {
    /* These checks are folded away for a compiled pairs(). */
    TRef func = getslot(J, ra-3);
    TRef trid = emitir(IRT(IR_FLOAD, IRT_U8), func, IRFL_FUNC_FFID);
    emitir(IRTGI(IR_EQ), trid, lj_ir_kint(J, FF_next));
    (void)getslot(J, ra-2); /* Type check for table. */
    (void)getslot(J, ra-1); /* Type check for nil key. */
    J->base[ra-1] = lj_ir_kint(J, 0) | TREF_KEYINDEX;
    J->maxslot = ra;
  } else {  /* Abort trace. Interpreter will despecialize bytecode. */
    lj_trace_err(J, LJ_TRERR_RECERR);
  }
}